

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

size_t quantize_q2_K(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  byte bVar1;
  ggml_fp16_t gVar2;
  ggml_fp16_t gVar3;
  int j;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint8_t *puVar8;
  float *pfVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  float *pfVar13;
  int j_1;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  int l;
  long lVar18;
  float *pfVar19;
  uint16_t s;
  float *pfVar20;
  void *pvVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  uint8_t local_268 [16];
  uint8_t Ls [16];
  float sw [16];
  uint8_t Laux [16];
  float weight [16];
  float scales [16];
  float mins [16];
  uint8_t L [256];
  
  sVar4 = ggml_row_size(GGML_TYPE_Q2_K,n_per_row);
  if (quant_weights == (float *)0x0) {
    quantize_row_q2_K_ref(src,(block_q2_K *)dst,n_per_row * nrow);
  }
  else {
    uVar14 = (long)((ulong)(uint)((int)n_per_row >> 0x1f) << 0x20 | n_per_row & 0xffffffffU) / 0x100
    ;
    uVar5 = uVar14 & 0xffffffff;
    lVar10 = 0;
    if ((int)uVar14 < 1) {
      uVar5 = 0;
    }
    lVar6 = 0;
    if (0 < nrow) {
      lVar6 = nrow;
    }
    lVar12 = (long)dst + 0x10;
    for (; lVar10 != lVar6; lVar10 = lVar10 + 1) {
      pfVar13 = quant_weights;
      lVar17 = lVar12;
      pfVar19 = src;
      pvVar21 = dst;
      for (uVar14 = 0; uVar14 != uVar5; uVar14 = uVar14 + 1) {
        sw[0xc] = 0.0;
        sw[0xd] = 0.0;
        sw[0xe] = 0.0;
        sw[0xf] = 0.0;
        sw[8] = 0.0;
        sw[9] = 0.0;
        sw[10] = 0.0;
        sw[0xb] = 0.0;
        sw[4] = 0.0;
        sw[5] = 0.0;
        sw[6] = 0.0;
        sw[7] = 0.0;
        sw[0] = 0.0;
        sw[1] = 0.0;
        sw[2] = 0.0;
        sw[3] = 0.0;
        fVar25 = 0.0;
        for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
          fVar25 = fVar25 + pfVar19[lVar7] * pfVar19[lVar7];
        }
        pfVar9 = pfVar13;
        pfVar20 = pfVar19;
        fVar25 = fVar25 * 0.00390625;
        for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
          fVar24 = fVar25;
          for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 1) {
            fVar23 = pfVar9[lVar18];
            fVar22 = pfVar20[lVar18] * pfVar20[lVar18] + fVar25;
            if (fVar22 < 0.0) {
              fVar25 = fVar24;
              fVar22 = sqrtf(fVar22);
              fVar24 = fVar25;
            }
            else {
              fVar22 = SQRT(fVar22);
            }
            weight[lVar18] = fVar23 * fVar22;
          }
          fVar23 = sw[lVar7];
          for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 1) {
            fVar23 = fVar23 + weight[lVar18];
          }
          sw[lVar7] = fVar23;
          fVar25 = make_qkx3_quants(0x10,3,pfVar19 + lVar7 * 0x10,weight,L + lVar7 * 0x10,
                                    mins + lVar7,Laux,fVar23,fVar25,(int)fVar24,SUB81(sVar4,0));
          scales[lVar7] = fVar25;
          pfVar20 = pfVar20 + 0x10;
          pfVar9 = pfVar9 + 0x10;
          fVar25 = fVar24;
        }
        fVar25 = make_qp_quants(0x10,0xf,scales,Ls,sw);
        fVar24 = make_qp_quants(0x10,0xf,mins,local_268,sw);
        gVar2 = ggml_compute_fp32_to_fp16(fVar25);
        lVar18 = uVar14 * 0x54;
        *(ggml_fp16_t *)((long)dst + lVar18 + 0x50) = gVar2;
        gVar3 = ggml_compute_fp32_to_fp16(fVar24);
        *(ggml_fp16_t *)((long)dst + lVar18 + 0x52) = gVar3;
        fVar25 = ggml_table_f32_f16[gVar2];
        fVar24 = ggml_table_f32_f16[gVar3];
        for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
          *(uint8_t *)((long)pvVar21 + lVar7) = local_268[lVar7] << 4 | Ls[lVar7];
        }
        puVar8 = L;
        pfVar9 = pfVar19;
        for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
          bVar1 = *(byte *)((long)dst + lVar7 + lVar18);
          fVar23 = (float)(bVar1 & 0xf) * fVar25;
          if ((fVar23 != 0.0) || (NAN(fVar23))) {
            for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
              uVar16 = (uint)((pfVar9[lVar15] + (float)(bVar1 >> 4) * fVar24) / fVar23 + 12582912.0)
                       & 0x7fffff;
              if (0x400002 < uVar16) {
                uVar16 = 0x400003;
              }
              if (uVar16 < 0x400001) {
                uVar16 = 0;
              }
              puVar8[lVar15] = (uint8_t)uVar16;
            }
          }
          pfVar9 = pfVar9 + 0x10;
          puVar8 = puVar8 + 0x10;
        }
        puVar8 = L + 0x60;
        lVar7 = lVar17;
        for (uVar11 = 0; uVar11 < 0x100; uVar11 = uVar11 + 0x80) {
          for (lVar18 = 0; lVar18 != 0x20; lVar18 = lVar18 + 1) {
            *(uint8_t *)(lVar7 + lVar18) =
                 puVar8[lVar18] << 6 | puVar8[lVar18 + -0x20] << 4 |
                 puVar8[lVar18 + -0x40] << 2 | puVar8[lVar18 + -0x60];
          }
          lVar7 = lVar7 + 0x20;
          puVar8 = puVar8 + 0x80;
        }
        pfVar19 = pfVar19 + 0x100;
        pfVar13 = pfVar13 + 0x100;
        pvVar21 = (void *)((long)pvVar21 + 0x54);
        lVar17 = lVar17 + 0x54;
      }
      src = src + n_per_row;
      dst = (void *)((long)dst + sVar4);
      lVar12 = lVar12 + sVar4;
    }
  }
  return sVar4 * nrow;
}

Assistant:

size_t quantize_q2_K(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    size_t row_size = ggml_row_size(GGML_TYPE_Q2_K, n_per_row);
    if (!quant_weights) {
        quantize_row_q2_K_ref(src, dst, (int64_t)nrow*n_per_row);
    }
    else {
        char * qrow = (char *)dst;
        for (int64_t row = 0; row < nrow; ++row) {
            quantize_row_q2_K_impl(src, (block_q2_K*)qrow, n_per_row, quant_weights);
            src += n_per_row;
            qrow += row_size;
        }
    }
    return nrow * row_size;
}